

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

int xmlDocFormatDump(FILE *f,xmlDocPtr cur,int format)

{
  int iVar1;
  int iVar2;
  xmlOutputBufferPtr out;
  xmlChar *name;
  xmlCharEncodingHandlerPtr handler;
  xmlSaveCtxt local_b8;
  
  handler = (xmlCharEncodingHandlerPtr)0x0;
  iVar2 = -1;
  if (cur == (xmlDocPtr)0x0) {
    return -1;
  }
  name = cur->encoding;
  if (name != (xmlChar *)0x0) {
    iVar1 = xmlOpenCharEncodingHandler((char *)name,1,&handler);
    if (iVar1 == 0) goto LAB_0016c316;
    (*xmlFree)(cur->encoding);
  }
  name = (xmlChar *)0x0;
LAB_0016c316:
  out = xmlOutputBufferCreateFile(f,handler);
  if (out != (xmlOutputBufferPtr)0x0) {
    memset(&local_b8,0,0x90);
    local_b8.encoding = name;
    local_b8.buf = out;
    xmlSaveCtxtInit(&local_b8,0x21 - (uint)(format == 0));
    xmlDocContentDumpOutput(&local_b8,cur);
    iVar2 = xmlOutputBufferClose(out);
  }
  return iVar2;
}

Assistant:

int
xmlDocFormatDump(FILE *f, xmlDocPtr cur, int format) {
    xmlSaveCtxt ctxt;
    xmlOutputBufferPtr buf;
    const char * encoding;
    xmlCharEncodingHandlerPtr handler = NULL;
    int ret;
    int options;

    if (cur == NULL) {
	return(-1);
    }
    encoding = (const char *) cur->encoding;

    if (encoding != NULL) {
        int res;

	res = xmlOpenCharEncodingHandler(encoding, /* output */ 1, &handler);
	if (res != XML_ERR_OK) {
	    xmlFree((char *) cur->encoding);
	    encoding = NULL;
	}
    }
    buf = xmlOutputBufferCreateFile(f, handler);
    if (buf == NULL) return(-1);
    memset(&ctxt, 0, sizeof(ctxt));
    ctxt.buf = buf;
    ctxt.level = 0;
    ctxt.encoding = (const xmlChar *) encoding;

    options = XML_SAVE_AS_XML;
    if (format)
        options |= XML_SAVE_FORMAT;
    xmlSaveCtxtInit(&ctxt, options);

    xmlDocContentDumpOutput(&ctxt, cur);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}